

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

bool nivalis::anon_unknown_0::check_for_cycle
               (vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                *funcs,uint64_t fid)

{
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this;
  pointer pUVar1;
  uint64_t *puVar2;
  size_type sVar3;
  bool bVar4;
  uint64_t *puVar5;
  long *in_FS_OFFSET;
  bool bVar6;
  uint64_t local_30;
  
  local_30 = fid;
  if ((char)in_FS_OFFSET[-0xe] == '\0') {
    in_FS_OFFSET[-0x15] = *in_FS_OFFSET + -0x78;
    in_FS_OFFSET[-0x14] = 1;
    in_FS_OFFSET[-0x13] = 0;
    in_FS_OFFSET[-0x12] = 0;
    *(undefined4 *)(in_FS_OFFSET + -0x11) = 0x3f800000;
    in_FS_OFFSET[-0x10] = 0;
    in_FS_OFFSET[-0xf] = 0;
    __cxa_thread_atexit(std::
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::~unordered_set,*in_FS_OFFSET + -0xa8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0xe) = 1;
  }
  this = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)(*in_FS_OFFSET + -0xa8);
  sVar3 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(this,&local_30);
  bVar4 = true;
  if (sVar3 == 0) {
    std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)this,&local_30);
    pUVar1 = (funcs->
             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar5 = *(uint64_t **)
              &pUVar1[local_30].deps.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    puVar2 = *(pointer *)
              ((long)&pUVar1[local_30].deps.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
    ;
    do {
      bVar6 = puVar5 == puVar2;
      bVar4 = !bVar6;
      if (bVar6) break;
      bVar6 = check_for_cycle(funcs,*puVar5);
      puVar5 = puVar5 + 1;
    } while (!bVar6);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(this,&local_30);
  }
  return bVar4;
}

Assistant:

bool check_for_cycle(const std::vector<Environment::UserFunction>& funcs,
                     uint64_t fid) {
    thread_local std::unordered_set<uint64_t> seen;
    if (seen.count(fid)) return true;
    seen.insert(fid);
    for (uint64_t dep_fid : funcs[fid].deps) {
        if (check_for_cycle(funcs, dep_fid)) {
            seen.erase(fid);
            return true;
        }
    }
    seen.erase(fid);
    return false;
}